

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::SharedCtor(KNearestNeighborsClassifier *this)

{
  KNearestNeighborsClassifier *this_local;
  
  memset(&this->nearestneighborsindex_,0,0x10);
  clear_has_ClassLabels(this);
  clear_has_DefaultClassLabel(this);
  clear_has_WeightingScheme(this);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void KNearestNeighborsClassifier::SharedCtor() {
  ::memset(&nearestneighborsindex_, 0, reinterpret_cast<char*>(&numberofneighbors_) -
    reinterpret_cast<char*>(&nearestneighborsindex_) + sizeof(numberofneighbors_));
  clear_has_ClassLabels();
  clear_has_DefaultClassLabel();
  clear_has_WeightingScheme();
  _cached_size_ = 0;
}